

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_view.hpp
# Opt level: O0

file_view_sptr __thiscall
vfs::open_read_write_view
          (vfs *this,path *fileName,file_creation_options creationOptions,file_flags fileFlags,
          file_attributes fileAttributes,int64_t viewSize)

{
  bool bVar1;
  element_type *this_00;
  stream_interface<vfs::file_view_interface<vfs::posix_file_view>> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  file_view_sptr fVar2;
  undefined1 local_40 [8];
  file_sptr spFile;
  int64_t viewSize_local;
  file_attributes fileAttributes_local;
  file_flags fileFlags_local;
  file_creation_options creationOptions_local;
  path *fileName_local;
  
  spFile.
  super___shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)viewSize;
  open_read_write((vfs *)local_40,fileName,creationOptions,fileFlags,fileAttributes);
  this_00 = std::
            __shared_ptr_access<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_40);
  bVar1 = file_interface<vfs::posix_file>::isValid(&this_00->super_file_interface<vfs::posix_file>);
  if (bVar1) {
    this_01 = (stream_interface<vfs::file_view_interface<vfs::posix_file_view>> *)operator_new(0x60)
    ;
    stream_interface<vfs::file_view_interface<vfs::posix_file_view>>::
    stream_interface<std::shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>>>,long&>
              (this_01,(shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>_> *)
                       local_40,
               (long *)&spFile.
                        super___shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
    std::shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>>>::
    shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>>,void>
              ((shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>>> *)
               this,(stream_interface<vfs::file_view_interface<vfs::posix_file_view>_> *)this_01);
  }
  else {
    std::shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>_>_>::
    shared_ptr((shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>_>_>
                *)this,(nullptr_t)0x0);
  }
  std::shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>_>::~shared_ptr
            ((shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>_> *)local_40);
  fVar2.
  super___shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  fVar2.
  super___shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (file_view_sptr)
         fVar2.
         super___shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline auto open_read_write_view
    (
        const path              &fileName,
        file_creation_options   creationOptions,
        file_flags              fileFlags = file_flags::none,
        file_attributes         fileAttributes = file_attributes::normal,
        int64_t                 viewSize = 0
    )
    {
        auto spFile = open_read_write(fileName, creationOptions, fileFlags, fileAttributes);
        return spFile->isValid() ? file_view_sptr(new file_view_stream(std::move(spFile), viewSize)) : nullptr;
    }